

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.hpp
# Opt level: O2

vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> * __thiscall
helics::TimeCoordinator::getDependents
          (vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
           *__return_storage_ptr__,TimeCoordinator *this)

{
  shared_handle local_28;
  
  gmlc::libguarded::
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::lock_shared(&local_28,&this->dependent_federates);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::vector
            (__return_storage_ptr__,local_28.data);
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalFederateId> getDependents() const
    {
        return *dependent_federates.lock_shared();
    }